

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

void test_abs<int>(uint length)

{
  int iVar1;
  int iVar2;
  int *__p;
  undefined1 (*pauVar3) [16];
  undefined8 *puVar4;
  undefined1 auVar5 [16];
  int local_314;
  int local_310;
  int i_2;
  int local_2fc;
  int i;
  int *v;
  shared_ptr<int> pv;
  int local_2d8;
  uint length_local;
  int i_1;
  int local_2bc;
  undefined1 (*local_2b8) [16];
  undefined1 (*local_2b0) [16];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  
  pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = length;
  __p = nosimd::common::malloc<int>(length);
  std::shared_ptr<int>::shared_ptr<int,void(*)(int*),void>
            ((shared_ptr<int> *)&v,__p,nosimd::common::free<int>);
  pauVar3 = (undefined1 (*) [16])
            std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)&v);
  for (local_2fc = 0;
      local_2fc <
      (int)pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      local_2fc = local_2fc + 1) {
    *(int *)(*pauVar3 + (long)local_2fc * 4) = -local_2fc;
  }
  local_2b8 = pauVar3;
  local_2b0 = pauVar3;
  for (local_2bc = (int)pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                        _4_4_ >> 2; 3 < local_2bc; local_2bc = local_2bc + -4) {
    auVar5 = pabsd(*local_2b0,*local_2b0);
    local_1e8 = auVar5._0_8_;
    uStack_1e0 = auVar5._8_8_;
    *(undefined8 *)*local_2b8 = local_1e8;
    *(undefined8 *)(*local_2b8 + 8) = uStack_1e0;
    auVar5 = pabsd(local_2b0[1],local_2b0[1]);
    local_208 = auVar5._0_8_;
    uStack_200 = auVar5._8_8_;
    *(undefined8 *)local_2b8[1] = local_208;
    *(undefined8 *)(local_2b8[1] + 8) = uStack_200;
    auVar5 = pabsd(local_2b0[2],local_2b0[2]);
    local_228 = auVar5._0_8_;
    uStack_220 = auVar5._8_8_;
    *(undefined8 *)local_2b8[2] = local_228;
    *(undefined8 *)(local_2b8[2] + 8) = uStack_220;
    auVar5 = pabsd(local_2b0[3],local_2b0[3]);
    local_248 = auVar5._0_8_;
    uStack_240 = auVar5._8_8_;
    *(undefined8 *)local_2b8[3] = local_248;
    *(undefined8 *)(local_2b8[3] + 8) = uStack_240;
    local_2b0 = local_2b0 + 4;
    local_2b8 = local_2b8 + 4;
  }
  if (1 < local_2bc) {
    auVar5 = pabsd(*local_2b0,*local_2b0);
    local_268 = auVar5._0_8_;
    uStack_260 = auVar5._8_8_;
    *(undefined8 *)*local_2b8 = local_268;
    *(undefined8 *)(*local_2b8 + 8) = uStack_260;
    auVar5 = pabsd(local_2b0[1],local_2b0[1]);
    local_288 = auVar5._0_8_;
    uStack_280 = auVar5._8_8_;
    *(undefined8 *)local_2b8[1] = local_288;
    *(undefined8 *)(local_2b8[1] + 8) = uStack_280;
    local_2bc = local_2bc + -2;
    local_2b0 = local_2b0 + 2;
    local_2b8 = local_2b8 + 2;
  }
  if (local_2bc != 0) {
    auVar5 = pabsd(*local_2b0,*local_2b0);
    local_2a8 = auVar5._0_8_;
    uStack_2a0 = auVar5._8_8_;
    *(undefined8 *)*local_2b8 = local_2a8;
    *(undefined8 *)(*local_2b8 + 8) = uStack_2a0;
  }
  for (local_2d8 = pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ -
                   (pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ &
                   3);
      local_2d8 <
      (int)pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      local_2d8 = local_2d8 + 1) {
    if (*(int *)(*pauVar3 + (long)local_2d8 * 4) < 1) {
      local_314 = -*(int *)(*pauVar3 + (long)local_2d8 * 4);
    }
    else {
      local_314 = *(int *)(*pauVar3 + (long)local_2d8 * 4);
    }
    *(int *)(*pauVar3 + (long)local_2d8 * 4) = local_314;
  }
  local_310 = 0;
  do {
    if ((int)pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ <=
        local_310) {
      std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)&v);
      return;
    }
    if (*(int *)(*pauVar3 + (long)local_310 * 4) < 0) {
      iVar1 = *(int *)(*pauVar3 + (long)local_310 * 4);
      iVar2 = std::numeric_limits<int>::min();
      if (iVar1 != iVar2) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_abs(unsigned int) [T = int]";
        *(undefined4 *)(puVar4 + 1) = 0x81;
        *(uint *)((long)puVar4 + 0xc) =
             pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
    }
    local_310 = local_310 + 1;
  } while( true );
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}